

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O1

int access_monster_buffer(void *buffer)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  ushort uVar10;
  int *piVar11;
  ushort uVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  if (buffer == (void *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)((ulong)*buffer + (long)buffer);
  }
  if (piVar11 == (int *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xd3,"int access_monster_buffer(const void *)");
  }
  lVar14 = -(long)*piVar11;
  uVar2 = *(ushort *)((long)piVar11 - (long)*piVar11);
  uVar3 = 0;
  if (9 < uVar2) {
    uVar3 = (uint)*(ushort *)((long)piVar11 + lVar14 + 8);
  }
  uVar8 = 0;
  if (uVar3 == 0) {
    bVar15 = false;
  }
  else {
    bVar15 = *(short *)((long)piVar11 + (ulong)uVar3) == 300;
  }
  if (7 < uVar2) {
    uVar8 = (uint)*(ushort *)((long)piVar11 + lVar14 + 6);
  }
  if (uVar8 == 0) {
    bVar16 = true;
  }
  else {
    bVar16 = *(short *)((long)piVar11 + (ulong)uVar8) == 0x96;
  }
  if (uVar2 < 0xc) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(ushort *)((long)piVar11 + lVar14 + 10);
  }
  if (uVar10 == 0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pcVar13 = (char *)((long)piVar11 +
                      (ulong)*(uint *)((long)piVar11 + (ulong)uVar10) + (ulong)uVar10 + 4);
  }
  if (pcVar13 == (char *)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = *(int *)(pcVar13 + -4) == 3;
  }
  if (!bVar15) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xdb,"int access_monster_buffer(const void *)");
  }
  if (!bVar16) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xdd,"int access_monster_buffer(const void *)");
  }
  iVar4 = strcmp(pcVar13,"Orc");
  if (iVar4 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xde,"int access_monster_buffer(const void *)");
  }
  if (!bVar17) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xdf,"int access_monster_buffer(const void *)");
  }
  bVar15 = true;
  bVar16 = true;
  if (9 < uVar2) {
    bVar16 = *(short *)((long)piVar11 + lVar14 + 8) == 0;
  }
  if (7 < uVar2) {
    bVar15 = *(short *)((long)piVar11 + lVar14 + 6) == 0;
  }
  if (bVar16) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xe3,"int access_monster_buffer(const void *)");
  }
  if (!bVar15) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xe4,"int access_monster_buffer(const void *)");
  }
  if (uVar2 < 6) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(ushort *)((long)piVar11 + lVar14 + 4);
  }
  if (uVar10 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xe8,"int access_monster_buffer(const void *)");
  }
  uVar5 = (ulong)uVar10;
  if ((*(float *)((long)piVar11 + uVar5) != 1.0) || (NAN(*(float *)((long)piVar11 + uVar5)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xf0,"int access_monster_buffer(const void *)");
  }
  fVar1 = *(float *)((long)piVar11 + uVar5 + 4);
  if ((fVar1 != 2.0) || (NAN(fVar1))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xf1,"int access_monster_buffer(const void *)");
  }
  fVar1 = *(float *)((long)piVar11 + uVar5 + 8);
  if ((fVar1 != 3.0) || (NAN(fVar1))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xf2,"int access_monster_buffer(const void *)");
  }
  if (uVar2 < 0x10) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(ushort *)((long)piVar11 + lVar14 + 0xe);
  }
  if (uVar10 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)piVar11 + (ulong)*(uint *)((long)piVar11 + (ulong)uVar10) + (ulong)uVar10 + 4;
  }
  if (lVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x105,"int access_monster_buffer(const void *)");
  }
  if (*(int *)(lVar6 + -4) != 10) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x107,"int access_monster_buffer(const void *)");
  }
  if (*(uint *)(lVar6 + -4) < 3) {
    __assert_fail("flatbuffers_vec_len(vec__tmp) > (i__tmp) && \"index out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/samples/monster/generated/flatbuffers_common_reader.h"
                  ,0x1d8,"uint8_t flatbuffers_uint8_vec_at(flatbuffers_uint8_vec_t, size_t)");
  }
  if (*(char *)(lVar6 + 2) != '\x02') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0x10b,"int access_monster_buffer(const void *)");
  }
  if (uVar2 < 0x14) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(ushort *)((long)piVar11 + lVar14 + 0x12);
  }
  if (uVar10 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)piVar11 + (ulong)*(uint *)((long)piVar11 + (ulong)uVar10) + (ulong)uVar10 + 4;
  }
  if ((lVar6 != 0) && (*(int *)(lVar6 + -4) == 2)) {
    if ((lVar6 == 0) || (*(uint *)(lVar6 + -4) < 2)) {
      __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/samples/monster/generated/monster_reader.h"
                    ,0xa8,
                    "MyGame_Sample_Weapon_table_t MyGame_Sample_Weapon_vec_at(MyGame_Sample_Weapon_vec_t, size_t)"
                   );
    }
    lVar6 = lVar6 + (ulong)*(uint *)(lVar6 + 4);
    piVar7 = (int *)(lVar6 + 4);
    lVar9 = -(long)*piVar7;
    uVar10 = *(ushort *)((long)piVar7 - (long)*piVar7);
    if (uVar10 < 6) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(ushort *)(lVar6 + 8 + lVar9);
    }
    uVar3 = 0;
    if (uVar12 == 0) {
      pcVar13 = (char *)0x0;
    }
    else {
      pcVar13 = (char *)((long)piVar7 +
                        (ulong)*(uint *)((long)piVar7 + (ulong)uVar12) + (ulong)uVar12 + 4);
    }
    if (7 < uVar10) {
      uVar3 = (uint)*(ushort *)(lVar6 + 10 + lVar9);
    }
    if (uVar3 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = *(short *)((long)piVar7 + (ulong)uVar3) == 5;
    }
    if ((pcVar13 == (char *)0x0) || (iVar4 = strcmp(pcVar13,"Axe"), iVar4 != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0x113,"int access_monster_buffer(const void *)");
    }
    if (!bVar15) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0x114,"int access_monster_buffer(const void *)");
    }
    uVar5 = 0;
    if (0x15 < uVar2) {
      uVar5 = (ulong)*(ushort *)((long)piVar11 + lVar14 + 0x14);
    }
    if (((int)uVar5 != 0) && (*(char *)((long)piVar11 + uVar5) == '\x01')) {
      if (uVar2 < 0x18) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)((long)piVar11 + lVar14 + 0x16);
      }
      if (uVar2 == 0) {
        piVar11 = (int *)0x0;
      }
      else {
        piVar11 = (int *)((long)piVar11 +
                         (ulong)*(uint *)((long)piVar11 + (ulong)uVar2) + (ulong)uVar2);
      }
      if (piVar11 == (int *)0x0) {
        __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/samples/monster/generated/monster_reader.h"
                      ,0xab,
                      "flatbuffers_string_t MyGame_Sample_Weapon_name(MyGame_Sample_Weapon_table_t)"
                     );
      }
      lVar14 = -(long)*piVar11;
      uVar2 = *(ushort *)((long)piVar11 - (long)*piVar11);
      if (uVar2 < 6) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(ushort *)((long)piVar11 + lVar14 + 4);
      }
      uVar3 = 0;
      if (uVar10 == 0) {
        pcVar13 = (char *)0x0;
      }
      else {
        pcVar13 = (char *)((long)piVar11 +
                          (ulong)*(uint *)((long)piVar11 + (ulong)uVar10) + (ulong)uVar10 + 4);
      }
      if (7 < uVar2) {
        uVar3 = (uint)*(ushort *)((long)piVar11 + lVar14 + 6);
      }
      if (uVar3 == 0) {
        bVar15 = false;
      }
      else {
        bVar15 = *(short *)((long)piVar11 + (ulong)uVar3) == 5;
      }
      iVar4 = strcmp(pcVar13,"Axe");
      if (iVar4 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0x11e,"int access_monster_buffer(const void *)");
      }
      if (!bVar15) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0x11f,"int access_monster_buffer(const void *)");
      }
    }
    return 0;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                ,0x10f,"int access_monster_buffer(const void *)");
}

Assistant:

int access_monster_buffer(const void *buffer)
{
    // Note that we use the `table_t` suffix when reading a table object
    // as opposed to the `ref_t` suffix used during the construction of
    // the buffer.
    ns(Monster_table_t) monster = ns(Monster_as_root(buffer));

    // Note: root object pointers are NOT the same as the `buffer` pointer.

    // Make sure the buffer is accessible.
    test_assert(monster != 0);

    int16_t hp = ns(Monster_hp(monster));
    int16_t mana = ns(Monster_mana(monster));
    // This is just a const char *, but it also supports a fast length operation.
    flatbuffers_string_t name = ns(Monster_name(monster));
    size_t name_len = flatbuffers_string_len(name);

    test_assert(hp == 300);
    // Since 150 is the default, we are reading a value that wasn't stored.
    test_assert(mana == 150);
    test_assert(0 == strcmp(name, "Orc"));
    test_assert(name_len == strlen("Orc"));

    int hp_present = ns(Monster_hp_is_present(monster)); // 1
    int mana_present = ns(Monster_mana_is_present(monster)); // 0
    test_assert(hp_present);
    test_assert(!mana_present);

    ns(Vec3_struct_t) pos = ns(Monster_pos(monster));
    // Make sure pos has been set.
    test_assert(pos != 0);
    float x = ns(Vec3_x(pos));
    float y = ns(Vec3_y(pos));
    float z = ns(Vec3_z(pos));

    // The literal `f` suffix is important because double literals does
    // not always map cleanly to 32-bit represention even with only a few digits:
    // `1.0 == 1.0f`, but `3.2 != 3.2f`.
    test_assert(x == 1.0f);
    test_assert(y == 2.0f);
    test_assert(z == 3.0f);

    // We can also read the position into a C-struct. We have to copy
    // because we generally do not know if the native endian format
    // matches the one stored in the buffer (pe: protocol endian).
    ns(Vec3_t) pos_vec;
    // `pe` indicates endian conversion from protocol to native.
    ns(Vec3_copy_from_pe(&pos_vec, pos));
    test_assert(pos_vec.x == 1.0f);
    test_assert(pos_vec.y == 2.0f);
    test_assert(pos_vec.z == 3.0f);

    // This is a const uint8_t *, but it shouldn't be accessed directly
    // to ensure proper endian conversion. However, uint8 (ubyte) are
    // not sensitive endianness, so we *could* have accessed it directly.
    // The compiler likely optimizes this so that it doesn't matter.
    flatbuffers_uint8_vec_t inv = ns(Monster_inventory(monster));
    size_t inv_len = flatbuffers_uint8_vec_len(inv);
    // Make sure the inventory has been set.
    test_assert(inv != 0);
    // If `inv` were absent, the length would 0, so the above test is redundant.
    test_assert(inv_len == 10);
    // Index 0 is the first, index 2 is the third.
    // NOTE: C++ uses the `Get` terminology for vector elemetns, C use `at`.
    uint8_t third_item = flatbuffers_uint8_vec_at(inv, 2);
    test_assert(third_item == 2);

    ns(Weapon_vec_t) weapons = ns(Monster_weapons(monster));
    size_t weapons_len = ns(Weapon_vec_len(weapons));
    test_assert(weapons_len == 2);
    // We can use `const char *` instead of `flatbuffers_string_t`.
    const char *second_weapon_name = ns(Weapon_name(ns(Weapon_vec_at(weapons, 1))));
    int16_t second_weapon_damage =  ns(Weapon_damage(ns(Weapon_vec_at(weapons, 1))));
    test_assert(second_weapon_name != 0 && strcmp(second_weapon_name, "Axe") == 0);
    test_assert(second_weapon_damage == 5);

    // Access union type field.
    if (ns(Monster_equipped_type(monster)) == ns(Equipment_Weapon)) {
        // Cast to appropriate type:
        // C does not require the cast to Weapon_table_t, but C++ does.
        ns(Weapon_table_t) weapon = (ns(Weapon_table_t)) ns(Monster_equipped(monster));
        const char *weapon_name = ns(Weapon_name(weapon));
        int16_t weapon_damage = ns(Weapon_damage(weapon));

        test_assert(0 == strcmp(weapon_name, "Axe"));
        test_assert(weapon_damage == 5);
    }
    return 0;
}